

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMacros.cpp
# Opt level: O2

void test_HEXDUMP(void)

{
  pointer piVar1;
  ostream *poVar2;
  int iVar3;
  double local_28;
  vector<int,_std::allocator<int>_> foo;
  
  std::vector<int,_std::allocator<int>_>::vector(&foo,0x20,(allocator_type *)&local_28);
  iVar3 = 1;
  for (piVar1 = foo.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar1 != foo.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar1 = piVar1 + 1) {
    *piVar1 = iVar3;
    iVar3 = iVar3 + 1;
  }
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  poVar2 = std::operator<<(_ZN8JEBDebugL6STREAME_0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/TestMacros/TestMacros.cpp:27: "
                          );
  poVar2 = std::operator<<(poVar2,"void test_HEXDUMP()");
  std::operator<<(poVar2,":\nfoo:\n");
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  JEBDebug::hexdump<std::vector<int,_std::allocator<int>_>,_0>(_ZN8JEBDebugL6STREAME_0,&foo);
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  std::endl<char,std::char_traits<char>>(_ZN8JEBDebugL6STREAME_0);
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  poVar2 = std::operator<<(_ZN8JEBDebugL6STREAME_0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/TestMacros/TestMacros.cpp:28: "
                          );
  poVar2 = std::operator<<(poVar2,"void test_HEXDUMP()");
  std::operator<<(poVar2,":\nfoo.data(), foo.size() * sizeof(int):\n");
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  JEBDebug::hexdump(_ZN8JEBDebugL6STREAME_0,
                    foo.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)foo.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)foo.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,0x10);
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  std::endl<char,std::char_traits<char>>(_ZN8JEBDebugL6STREAME_0);
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  poVar2 = std::operator<<(_ZN8JEBDebugL6STREAME_0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/TestMacros/TestMacros.cpp:29: "
                          );
  poVar2 = std::operator<<(poVar2,"void test_HEXDUMP()");
  std::operator<<(poVar2,":\n-1.0:\n");
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  local_28 = -1.0;
  JEBDebug::hexdump<double,_0>(_ZN8JEBDebugL6STREAME_0,&local_28);
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  std::endl<char,std::char_traits<char>>(_ZN8JEBDebugL6STREAME_0);
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  poVar2 = std::operator<<(_ZN8JEBDebugL6STREAME_0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/TestMacros/TestMacros.cpp:30: "
                          );
  poVar2 = std::operator<<(poVar2,"void test_HEXDUMP()");
  std::operator<<(poVar2,":\n0.0:\n");
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  local_28 = 0.0;
  JEBDebug::hexdump<double,_0>(_ZN8JEBDebugL6STREAME_0,&local_28);
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  std::endl<char,std::char_traits<char>>(_ZN8JEBDebugL6STREAME_0);
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  poVar2 = std::operator<<(_ZN8JEBDebugL6STREAME_0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jebreimo[P]JEBDebug/examples/TestMacros/TestMacros.cpp:31: "
                          );
  poVar2 = std::operator<<(poVar2,"void test_HEXDUMP()");
  std::operator<<(poVar2,":\n1.0:\n");
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  local_28 = 1.0;
  JEBDebug::hexdump<double,_0>(_ZN8JEBDebugL6STREAME_0,&local_28);
  if (_ZN8JEBDebugL6STREAME_0 == (ostream *)0x0) {
    _ZN8JEBDebugL6STREAME_0 = (ostream *)&std::clog;
  }
  std::endl<char,std::char_traits<char>>(_ZN8JEBDebugL6STREAME_0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&foo.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_HEXDUMP()
{
    std::vector<int> foo(32);
    std::iota(foo.begin(), foo.end(), 1);
    JEB_HEXDUMP(foo);
    JEB_HEXDUMP(foo.data(), foo.size() * sizeof(int));
    JEB_HEXDUMP(-1.0);
    JEB_HEXDUMP(0.0);
    JEB_HEXDUMP(1.0);
}